

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool MeCab::FeatureIndex::convert(Param *param,char *txtfile,string *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  long *plVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  size_type sVar11;
  scoped_fixed_array<char,_8192> *psVar12;
  reference pvVar13;
  char *in_RDX;
  char *in_RSI;
  uint64_t fp_1;
  size_t i_1;
  double alpha_1;
  size_t i;
  char charset_buf [32];
  uint size;
  double alpha;
  uint64_t fp;
  string feature;
  Iconv iconv;
  string to;
  string from;
  string model_charset;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> dic;
  char *column [4];
  scoped_fixed_array<char,_8192> buf;
  ifstream ifs;
  value_type *in_stack_fffffffffffff998;
  scoped_fixed_array<char,_8192> *in_stack_fffffffffffff9a0;
  scoped_fixed_array<char,_8192> *this;
  Iconv *in_stack_fffffffffffff9a8;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __last;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __first;
  ostream *in_stack_fffffffffffff9c8;
  ostream *in_stack_fffffffffffff9d0;
  ostream *in_stack_fffffffffffff9d8;
  ostream *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  Param *in_stack_fffffffffffffa68;
  unsigned_long local_3e0;
  ulong local_3d8;
  double local_3d0;
  scoped_fixed_array<char,_8192> *local_3c8;
  pair<unsigned_long,_double> *local_3c0;
  pair<unsigned_long,_double> *local_3b8;
  undefined1 local_3a9;
  pair<unsigned_long,_double> local_3a8 [2];
  undefined4 local_37c;
  pair<unsigned_long,_double> local_378;
  double local_368;
  uint64_t local_360;
  byte local_353;
  die local_352;
  allocator local_351;
  string local_350 [36];
  byte local_32c;
  die local_32b;
  byte local_32a;
  die local_329;
  Iconv local_328;
  byte local_312;
  die local_311;
  string local_310 [32];
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [38];
  byte local_2a2;
  die local_2a1;
  string local_2a0 [32];
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  local_280;
  char *local_268;
  char *local_260;
  scoped_fixed_array<char,_8192> local_248;
  byte local_22e;
  die local_22d [13];
  long local_220 [65];
  char *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ifstream::ifstream(local_220,in_RSI,_S_in);
  local_22e = 0;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (!bVar1) {
    die::die(local_22d);
    local_22e = 1;
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x21d);
    poVar5 = std::operator<<(poVar5,") [");
    poVar5 = std::operator<<(poVar5,"ifs");
    poVar5 = std::operator<<(poVar5,"] ");
    poVar5 = std::operator<<(poVar5,"no such file or directory: ");
    poVar5 = std::operator<<(poVar5,local_10);
    die::operator&(local_22d,poVar5);
  }
  if ((local_22e & 1) != 0) {
    die::~die((die *)0x10f15c);
  }
  scoped_fixed_array<char,_8192>::scoped_fixed_array(in_stack_fffffffffffff9a0);
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            *)0x10f178);
  std::__cxx11::string::string(local_2a0);
  while( true ) {
    pcVar6 = scoped_fixed_array<char,_8192>::get(&local_248);
    scoped_fixed_array<char,_8192>::size(&local_248);
    plVar7 = (long *)std::istream::getline((char *)local_220,(long)pcVar6);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
    if (!bVar1) break;
    pcVar6 = scoped_fixed_array<char,_8192>::get(&local_248);
    sVar8 = strlen(pcVar6);
    if (sVar8 == 0) break;
    local_2a2 = 0;
    scoped_fixed_array<char,_8192>::get(&local_248);
    sVar10 = tokenize2<char**>((char *)in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8,
                               (char **)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8)
    ;
    if (sVar10 != 2) {
      die::die(&local_2a1);
      local_2a2 = 1;
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x227);
      poVar5 = std::operator<<(poVar5,") [");
      poVar5 = std::operator<<(poVar5,"tokenize2(buf.get(), \":\", column, 2) == 2");
      poVar5 = std::operator<<(poVar5,"] ");
      poVar5 = std::operator<<(poVar5,"format error: ");
      pcVar6 = scoped_fixed_array<char,_8192>::get(&local_248);
      poVar5 = std::operator<<(poVar5,pcVar6);
      die::operator&(&local_2a1,poVar5);
    }
    if ((local_2a2 & 1) != 0) {
      die::~die((die *)0x10f448);
    }
    pcVar6 = local_268;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,pcVar6,&local_2c9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    if (bVar1) {
      std::__cxx11::string::operator=(local_2a0,local_260 + 1);
    }
  }
  Param::get<std::__cxx11::string>
            (in_stack_fffffffffffffa68,
             (char *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
  Param::get<std::__cxx11::string>
            (in_stack_fffffffffffffa68,
             (char *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    std::__cxx11::string::c_str();
    local_312 = 0;
    iVar2 = decode_charset(in_stack_fffffffffffff9f8);
    std::__cxx11::string::c_str();
    iVar3 = decode_charset(in_stack_fffffffffffff9f8);
    if (iVar2 != iVar3) {
      die::die(&local_311);
      local_312 = 1;
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x233);
      poVar5 = std::operator<<(poVar5,") [");
      poVar5 = std::operator<<(poVar5,
                               "decode_charset(model_charset.c_str()) == decode_charset(from.c_str())"
                              );
      poVar5 = std::operator<<(poVar5,"] ");
      poVar5 = std::operator<<(poVar5,"dictionary charset and model charset are different. ");
      poVar5 = std::operator<<(poVar5,"dictionary_charset=");
      poVar5 = std::operator<<(poVar5,local_2f0);
      poVar5 = std::operator<<(poVar5," model_charset=");
      poVar5 = std::operator<<(poVar5,local_2a0);
      die::operator&(&local_311,poVar5);
    }
    if ((local_312 & 1) != 0) {
      die::~die((die *)0x10f7ad);
    }
  }
  else {
    std::__cxx11::string::operator=(local_2f0,local_2a0);
  }
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) != 0) {
    std::__cxx11::string::operator=(local_310,local_2f0);
  }
  Iconv::Iconv(&local_328);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar2 = std::__cxx11::string::c_str();
  local_32a = 0;
  uVar4 = Iconv::open(&local_328,pcVar6,iVar2);
  if ((uVar4 & 1) == 0) {
    die::die(&local_329);
    local_32a = 1;
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x240);
    poVar5 = std::operator<<(poVar5,") [");
    poVar5 = std::operator<<(poVar5,"iconv.open(from.c_str(), to.c_str())");
    poVar5 = std::operator<<(poVar5,"] ");
    poVar5 = std::operator<<(poVar5,"cannot create model from=");
    poVar5 = std::operator<<(poVar5,local_2f0);
    poVar5 = std::operator<<(poVar5," to=");
    poVar5 = std::operator<<(poVar5,local_310);
    die::operator&(&local_329,poVar5);
  }
  if ((local_32a & 1) != 0) {
    die::~die((die *)0x10fa38);
  }
  while( true ) {
    pcVar6 = scoped_fixed_array<char,_8192>::get(&local_248);
    scoped_fixed_array<char,_8192>::size(&local_248);
    plVar7 = (long *)std::istream::getline((char *)local_220,(long)pcVar6);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
    if (!bVar1) break;
    local_32c = 0;
    scoped_fixed_array<char,_8192>::get(&local_248);
    sVar10 = tokenize2<char**>((char *)in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8,
                               (char **)in_stack_fffffffffffff9d0,(size_t)in_stack_fffffffffffff9c8)
    ;
    if (sVar10 != 2) {
      die::die(&local_32b);
      local_32c = 1;
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x245);
      poVar5 = std::operator<<(poVar5,") [");
      poVar5 = std::operator<<(poVar5,"tokenize2(buf.get(), \"\\t\", column, 2) == 2");
      poVar5 = std::operator<<(poVar5,"] ");
      poVar5 = std::operator<<(poVar5,"format error: ");
      pcVar6 = scoped_fixed_array<char,_8192>::get(&local_248);
      poVar5 = std::operator<<(poVar5,pcVar6);
      die::operator&(&local_32b,poVar5);
    }
    if ((local_32c & 1) != 0) {
      die::~die((die *)0x10fc5e);
    }
    pcVar6 = local_260;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_350,pcVar6,&local_351);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    local_353 = 0;
    bVar1 = Iconv::convert(in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0);
    if (!bVar1) {
      die::die(&local_352);
      local_353 = 1;
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      in_stack_fffffffffffff9e0 = std::operator<<(poVar5,"(");
      in_stack_fffffffffffff9d8 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9e0,0x248);
      in_stack_fffffffffffff9d0 = std::operator<<(in_stack_fffffffffffff9d8,") [");
      in_stack_fffffffffffff9c8 =
           std::operator<<(in_stack_fffffffffffff9d0,"iconv.convert(&feature)");
      poVar5 = std::operator<<(in_stack_fffffffffffff9c8,"] ");
      die::operator&(&local_352,poVar5);
    }
    if ((local_353 & 1) != 0) {
      die::~die((die *)0x10fdab);
    }
    local_360 = fingerprint((string *)in_stack_fffffffffffff9a0);
    local_368 = atof(local_268);
    std::pair<unsigned_long,_double>::pair<unsigned_long,_double,_true>
              (&local_378,&local_360,&local_368);
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    push_back((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    std::__cxx11::string::~string(local_350);
  }
  std::__cxx11::string::clear();
  sVar11 = std::
           vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           ::size(&local_280);
  local_37c = (undefined4)sVar11;
  std::__cxx11::string::append(local_18,(ulong)&local_37c);
  local_3a9 = 0;
  std::fill<char*,char>
            ((char *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998,(char *)0x10ff86);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __first._M_current = local_3a8;
  strncpy((char *)__first._M_current,pcVar6,0x1f);
  std::__cxx11::string::append(local_18,(ulong)__first._M_current);
  __last._M_current = (pair<unsigned_long,_double> *)&local_280;
  local_3b8 = (pair<unsigned_long,_double> *)
              std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::begin((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       *)in_stack_fffffffffffff998);
  local_3c0 = (pair<unsigned_long,_double> *)
              std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::end((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     *)in_stack_fffffffffffff998);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>>
            (__first,__last);
  local_3c8 = (scoped_fixed_array<char,_8192> *)0x0;
  while (this = local_3c8,
        psVar12 = (scoped_fixed_array<char,_8192> *)
                  std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::size(&local_280), this < psVar12) {
    pvVar13 = std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::operator[](&local_280,(size_type)local_3c8);
    local_3d0 = pvVar13->second;
    std::__cxx11::string::append(local_18,(ulong)&local_3d0);
    local_3c8 = (scoped_fixed_array<char,_8192> *)((long)&local_3c8->_vptr_scoped_fixed_array + 1);
  }
  local_3d8 = 0;
  while (uVar9 = local_3d8,
        sVar11 = std::
                 vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                 ::size(&local_280), uVar9 < sVar11) {
    pvVar13 = std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::operator[](&local_280,local_3d8);
    local_3e0 = pvVar13->first;
    std::__cxx11::string::append(local_18,(ulong)&local_3e0);
    local_3d8 = local_3d8 + 1;
  }
  Iconv::~Iconv(&local_328);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_2a0);
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::~vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             *)__first._M_current);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(this);
  std::ifstream::~ifstream(local_220);
  return true;
}

Assistant:

bool FeatureIndex::convert(const Param &param,
                           const char* txtfile, std::string *output) {
  std::ifstream ifs(WPATH(txtfile));
  CHECK_DIE(ifs) << "no such file or directory: " << txtfile;
  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];
  std::vector<std::pair<uint64_t, double> > dic;
  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    }
  }

  std::string from = param.get<std::string>("dictionary-charset");
  std::string to = param.get<std::string>("charset");

  if (!from.empty()) {
    CHECK_DIE(decode_charset(model_charset.c_str())
              == decode_charset(from.c_str()))
        << "dictionary charset and model charset are different. "
        << "dictionary_charset=" << from
        << " model_charset=" << model_charset;
  } else {
    from = model_charset;
  }

  if (to.empty()) {
    to = from;
  }

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
            << "cannot create model from=" << from
            << " to=" << to;

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    const uint64_t fp = fingerprint(feature);
    const double alpha = atof(column[0]);
    dic.push_back(std::pair<uint64_t, double>(fp, alpha));
  }

  output->clear();
  unsigned int size = static_cast<unsigned int>(dic.size());
  output->append(reinterpret_cast<const char*>(&size), sizeof(size));

  char charset_buf[32];
  std::fill(charset_buf, charset_buf + sizeof(charset_buf), '\0');
  std::strncpy(charset_buf, to.c_str(), 31);
  output->append(reinterpret_cast<const char *>(charset_buf),
                 sizeof(charset_buf));

  std::sort(dic.begin(), dic.end());

  for (size_t i = 0; i < dic.size(); ++i) {
    const double alpha = dic[i].second;
    output->append(reinterpret_cast<const char *>(&alpha), sizeof(alpha));
  }

  for (size_t i = 0; i < dic.size(); ++i) {
    const uint64_t fp = dic[i].first;
    output->append(reinterpret_cast<const char *>(&fp), sizeof(fp));
  }

  return true;
}